

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,float power)

{
  bool bVar1;
  
  if ((power == 1.0) && (!NAN(power))) {
    bVar1 = DragScalarN(label,data_type,p_data,components,v_speed,p_min,p_max,format,0);
    return bVar1;
  }
  __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                ,0x990,
                "bool ImGui::DragScalarN(const char *, ImGuiDataType, void *, int, float, const void *, const void *, const char *, float)"
               );
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalarN(label, data_type, p_data, components, v_speed, p_min, p_max, format, drag_flags);
}